

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O1

string * cmStrCat<char_const(&)[14],int&,char_const(&)[22],unsigned_long>
                   (string *__return_storage_ptr__,char (*a) [14],int *b,char (*args) [22],
                   unsigned_long *args_1)

{
  cmAlphaNum *pcVar1;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  undefined1 local_100 [56];
  undefined1 local_c8 [56];
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_90;
  size_t local_78;
  string *local_70;
  cmAlphaNum *local_68;
  size_t local_60;
  char (*local_58) [22];
  undefined8 local_50;
  size_t local_48;
  string *local_40;
  cmAlphaNum *local_38;
  
  local_90.first._M_len = strlen(*a);
  local_90.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_90.first._M_str = *a;
  cmAlphaNum::cmAlphaNum((cmAlphaNum *)local_c8,*b);
  pcVar1 = (cmAlphaNum *)(local_c8 + 0x10);
  if ((cmAlphaNum *)local_c8._0_8_ != (cmAlphaNum *)0x0) {
    pcVar1 = (cmAlphaNum *)local_c8._0_8_;
  }
  local_70 = pcVar1->RValueString_;
  pcVar1 = (cmAlphaNum *)local_c8;
  if ((cmAlphaNum *)local_c8._0_8_ != (cmAlphaNum *)0x0) {
    pcVar1 = (cmAlphaNum *)local_c8._0_8_;
  }
  local_78 = (pcVar1->View_)._M_len;
  local_68 = (cmAlphaNum *)local_c8._0_8_;
  local_60 = strlen(*args);
  local_50 = 0;
  local_58 = args;
  cmAlphaNum::cmAlphaNum((cmAlphaNum *)local_100,*args_1);
  pcVar1 = (cmAlphaNum *)(local_100 + 0x10);
  if ((cmAlphaNum *)local_100._0_8_ != (cmAlphaNum *)0x0) {
    pcVar1 = (cmAlphaNum *)local_100._0_8_;
  }
  local_40 = pcVar1->RValueString_;
  pcVar1 = (cmAlphaNum *)local_100;
  if ((cmAlphaNum *)local_100._0_8_ != (cmAlphaNum *)0x0) {
    pcVar1 = (cmAlphaNum *)local_100._0_8_;
  }
  local_48 = (pcVar1->View_)._M_len;
  local_38 = (cmAlphaNum *)local_100._0_8_;
  views._M_len = 4;
  views._M_array = &local_90;
  cmCatViews(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(A&& a, B&& b, AV&&... args)
{
  static auto const makePair =
    [](const cmAlphaNum& arg) -> std::pair<cm::string_view, std::string*> {
    return { arg.View(), arg.RValueString() };
  };

  return cmCatViews({ makePair(std::forward<A>(a)),
                      makePair(std::forward<B>(b)),
                      makePair(std::forward<AV>(args))... });
}